

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O3

void __thiscall ActionQueue::~ActionQueue(ActionQueue *this)

{
  if ((this->queue).c.
      super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->queue).c.
      super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
      ::pop_front((deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                   *)this);
    } while ((this->queue).c.
             super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->queue).c.
             super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
  ::~deque((deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
            *)this);
  return;
}

Assistant:

ActionQueue::~ActionQueue()
{
	while (!this->queue.empty())
	{
		this->queue.pop();
	}
}